

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tsbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  char cVar1;
  char *sbbuff;
  long ii;
  int *idata;
  int flagval;
  double zero_local;
  double scale_local;
  int nullval_local;
  void *nullflagval_local;
  int nullcheck_local;
  long tilelen_local;
  void *tiledata_local;
  fitsfile *outfptr_local;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != -128.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    outfptr_local._4_4_ = 0x19d;
  }
  else {
    if (((outfptr->Fptr->compress_type == 0xb) || (outfptr->Fptr->compress_type == 0x15)) ||
       ((outfptr->Fptr->compress_type == 0x16 || (outfptr->Fptr->compress_type == 0x33)))) {
      *intlength = 1;
      if (nullcheck == 1) {
        cVar1 = *nullflagval;
        for (sbbuff = (char *)(tilelen + -1); -1 < (long)sbbuff; sbbuff = sbbuff + -1) {
          if (*(char *)((long)tiledata + (long)sbbuff) == cVar1) {
            *(char *)((long)tiledata + (long)sbbuff) = (char)nullval;
          }
          else {
            *(byte *)((long)tiledata + (long)sbbuff) =
                 *(byte *)((long)tiledata + (long)sbbuff) ^ 0x80;
          }
        }
      }
      else {
        for (sbbuff = (char *)(tilelen + -1); -1 < (long)sbbuff; sbbuff = sbbuff + -1) {
          *(byte *)((long)tiledata + (long)sbbuff) = *(byte *)((long)tiledata + (long)sbbuff) ^ 0x80
          ;
        }
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        cVar1 = *nullflagval;
        for (sbbuff = (char *)(tilelen + -1); -1 < (long)sbbuff; sbbuff = sbbuff + -1) {
          if (*(char *)((long)tiledata + (long)sbbuff) == cVar1) {
            *(int *)((long)tiledata + (long)sbbuff * 4) = nullval;
          }
          else {
            *(int *)((long)tiledata + (long)sbbuff * 4) =
                 *(char *)((long)tiledata + (long)sbbuff) + 0x80;
          }
        }
      }
      else {
        fits_sbyte_to_int_inplace((char *)tiledata,tilelen,status);
      }
    }
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_convert_tile_tsbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    signed char *sbbuff;

       /* datatype of input array is signed byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = -128.  */

       if (zbitpix != BYTE_IMG|| scale != 1.0 || zero != -128.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       }

       idata = (int *) tiledata;
       sbbuff = (signed char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               /* offset the other pixel values (by flipping the MSB) */

               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       sbbuff[ii] = (signed char) nullval;
                    else
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;               }
           } else {  /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--) 
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;
           }

       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = ((int) sbbuff[ii]) + 128;
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbbuff to an I*4 array, in place */
                 /* sbbuff must have been allocated large enough to do this */
                 fits_sbyte_to_int_inplace(sbbuff, tilelen, status);
           }
       }
 
       return(*status);
}